

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

void __thiscall tst_InsertProxyModel::testSetItemDataDataChanged(tst_InsertProxyModel *this)

{
  QObject *parent;
  initializer_list<std::pair<int,_QVariant>_> list;
  uint uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  uint *puVar6;
  undefined4 *puVar7;
  ModelTest *this_00;
  const_reference pQVar8;
  QVariant *pQVar9;
  pair<int,_QVariant> *local_450;
  qint32 local_434;
  qsizetype local_430;
  int local_424;
  QVariant local_420;
  ItemDataRole local_400 [2];
  qsizetype local_3f8;
  QList<int> local_3f0;
  QModelIndex local_3d8;
  QModelIndex local_3c0;
  value_type local_3a8;
  qint32 local_38c;
  qsizetype local_388;
  int local_37c;
  QVariant local_378;
  ItemDataRole local_358 [6];
  qsizetype local_340;
  undefined1 local_338 [8];
  QList<int> rolesVector;
  QModelIndex local_308;
  undefined1 local_2f0 [8];
  value_type argList;
  qsizetype local_2d0;
  undefined1 local_2c8 [8];
  QSignalSpy proxyDataChangeSpy;
  QVariant local_240;
  QModelIndex local_220;
  undefined1 local_208 [8];
  QModelIndex proxyIdX;
  InsertProxyModel local_1e8 [8];
  InsertProxyModel proxyModel;
  QArrayDataPointer<char16_t> local_1c8;
  QString local_1b0;
  QVariant local_198;
  int local_174;
  QArrayDataPointer<char16_t> local_170;
  QString local_158;
  QVariant local_140;
  int local_120 [4];
  QVariant local_110;
  int local_ec;
  pair<int,_QVariant> *local_e8;
  pair<int,_QVariant> local_e0;
  pair<int,_QVariant> pStack_b8;
  pair<int,_QVariant> pStack_90;
  iterator local_68;
  undefined1 local_60 [16];
  QMap<int,_QVariant> itemDataSet;
  int idxCol;
  int idxRow;
  QAbstractItemModel *baseModel;
  tst_InsertProxyModel *this_local;
  char16_t *str;
  char16_t *str_1;
  
  iVar4 = qMetaTypeId<QAbstractItemModel*>();
  puVar5 = (undefined8 *)QTest::qData("baseModel",iVar4);
  parent = (QObject *)*puVar5;
  if (parent != (QObject *)0x0) {
    iVar4 = qMetaTypeId<int>();
    puVar6 = (uint *)QTest::qData("idxRow",iVar4);
    itemDataSet.d.d._4_4_ = *puVar6;
    iVar4 = qMetaTypeId<int>();
    puVar7 = (undefined4 *)QTest::qData("idxCol",iVar4);
    itemDataSet.d.d._0_4_ = *puVar7;
    local_e8 = &local_e0;
    local_ec = 0x100;
    QVariant::QVariant(&local_110,5);
    std::make_pair<int,QVariant>(&local_e0,&local_ec,&local_110);
    local_120[0] = 0;
    local_e8 = &pStack_b8;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_170,(Data *)0x0,L"Test",4);
    QString::QString(&local_158,&local_170);
    QVariant::QVariant(&local_140,&local_158);
    std::make_pair<int,QVariant>(&pStack_b8,local_120,&local_140);
    local_174 = 3;
    local_e8 = &pStack_90;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1c8,(Data *)0x0,L"ToolTip",7);
    QString::QString(&local_1b0,&local_1c8);
    QVariant::QVariant(&local_198,&local_1b0);
    std::make_pair<int,QVariant>(&pStack_90,&local_174,&local_198);
    local_68 = &local_e0;
    local_60._0_8_ = 1.48219693752374e-323;
    list._M_len = 3;
    list._M_array = local_68;
    QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)(local_60 + 8),list);
    local_450 = (pair<int,_QVariant> *)&local_68;
    do {
      local_450 = local_450 + -1;
      std::pair<int,_QVariant>::~pair(local_450);
    } while (local_450 != &local_e0);
    QVariant::~QVariant(&local_198);
    QString::~QString(&local_1b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
    QVariant::~QVariant(&local_140);
    QString::~QString(&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
    QVariant::~QVariant(&local_110);
    InsertProxyModel::InsertProxyModel(local_1e8,(QObject *)0x0);
    this_00 = (ModelTest *)operator_new(0x10);
    ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_1e8,parent);
    InsertProxyModel::setMergeDisplayEdit(SUB81(local_1e8,0));
    proxyIdX.m._4_4_ = operator|(InsertColumn,InsertRow);
    InsertProxyModel::setInsertDirection((QFlags_conflict1 *)local_1e8);
    InsertProxyModel::setSourceModel((QAbstractItemModel *)local_1e8);
    uVar1 = itemDataSet.d.d._4_4_;
    QModelIndex::QModelIndex(&local_220);
    InsertProxyModel::index((int)local_208,(int)local_1e8,(QModelIndex *)(ulong)uVar1);
    QVariant::QVariant(&local_240,2);
    bVar2 = InsertProxyModel::setData
                      ((QModelIndex *)local_1e8,(QVariant *)local_208,(int)&local_240);
    bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                           "proxyModel.setData(proxyIdX, Qt::AlignRight, Qt::TextAlignmentRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x351);
    QVariant::~QVariant(&local_240);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      QSignalSpy::QSignalSpy
                ((QSignalSpy *)local_2c8,(QObject *)local_1e8,
                 "2dataChanged(QModelIndex, QModelIndex, QVector<int>)");
      bVar2 = InsertProxyModel::setItemData((QModelIndex *)local_1e8,(QMap *)local_208);
      bVar2 = QTest::qVerify((bool)(bVar2 & 1),"proxyModel.setItemData(proxyIdX, itemDataSet)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x353);
      if ((bVar2 & 1) == 0) {
        proxyDataChangeSpy._124_4_ = 1;
      }
      else {
        local_2d0 = QList<QList<QVariant>_>::size
                              ((QList<QList<QVariant>_> *)&proxyDataChangeSpy.field_0x8);
        argList.d.size._4_4_ = 1;
        bVar3 = QTest::qCompare<long_long,int>
                          (&local_2d0,(qint32 *)((long)&argList.d.size + 4),
                           "proxyDataChangeSpy.size()","1",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x354);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          QList<QList<QVariant>_>::takeFirst
                    ((value_type *)local_2f0,
                     (QList<QList<QVariant>_> *)&proxyDataChangeSpy.field_0x8);
          pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_2f0,0);
          QVariant::value<QModelIndex>(&local_308,pQVar8);
          bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                            (&local_308,(QModelIndex *)local_208,
                             "argList.at(0).value<QModelIndex>()","proxyIdX",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x356);
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_2f0,1);
            QVariant::value<QModelIndex>((QModelIndex *)&rolesVector.d.size,pQVar8);
            bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                              ((QModelIndex *)&rolesVector.d.size,(QModelIndex *)local_208,
                               "argList.at(1).value<QModelIndex>()","proxyIdX",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                               ,0x357);
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_2f0,2);
              QVariant::value<QList<int>>((QList<int> *)local_338,pQVar8);
              local_340 = QList<int>::size((QList<int> *)local_338);
              local_358[5] = 4;
              bVar3 = QTest::qCompare<long_long,int>
                                (&local_340,(qint32 *)(local_358 + 5),"rolesVector.size()","4",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                 ,0x35a);
              if (((bVar3 ^ 0xffU) & 1) == 0) {
                local_358[4] = 7;
                bVar3 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                  ((QListSpecialMethodsBase<int> *)local_338,local_358 + 4);
                bVar2 = QTest::qVerify(!bVar3,"!rolesVector.contains(Qt::TextAlignmentRole)","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                       ,0x35b);
                if (((bVar2 ^ 0xff) & 1) == 0) {
                  local_358[3] = 3;
                  bVar3 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                    ((QListSpecialMethodsBase<int> *)local_338,local_358 + 3);
                  bVar2 = QTest::qVerify(bVar3,"rolesVector.contains(Qt::ToolTipRole)","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                         ,0x35d);
                  if (((bVar2 ^ 0xff) & 1) == 0) {
                    local_358[2] = 2;
                    bVar3 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                      ((QListSpecialMethodsBase<int> *)local_338,local_358 + 2);
                    bVar2 = QTest::qVerify(bVar3,"rolesVector.contains(Qt::EditRole)","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                           ,0x35e);
                    if (((bVar2 ^ 0xff) & 1) == 0) {
                      local_358[1] = 0;
                      bVar3 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                        ((QListSpecialMethodsBase<int> *)local_338,local_358 + 1);
                      bVar2 = QTest::qVerify(bVar3,"rolesVector.contains(Qt::DisplayRole)","",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                             ,0x35f);
                      if (((bVar2 ^ 0xff) & 1) == 0) {
                        local_358[0] = UserRole;
                        bVar3 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                          ((QListSpecialMethodsBase<int> *)local_338,local_358);
                        bVar2 = QTest::qVerify(bVar3,"rolesVector.contains(Qt::UserRole)","",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                               ,0x360);
                        if (((bVar2 ^ 0xff) & 1) == 0) {
                          QVariant::QVariant(&local_378,6);
                          local_37c = 0x100;
                          pQVar9 = QMap<int,_QVariant>::operator[]
                                             ((QMap<int,_QVariant> *)(local_60 + 8),&local_37c);
                          QVariant::operator=(pQVar9,&local_378);
                          QVariant::~QVariant(&local_378);
                          bVar2 = InsertProxyModel::setItemData
                                            ((QModelIndex *)local_1e8,(QMap *)local_208);
                          bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                 "proxyModel.setItemData(proxyIdX, itemDataSet)","",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                 ,0x362);
                          if ((bVar2 & 1) == 0) {
                            proxyDataChangeSpy._124_4_ = 1;
                          }
                          else {
                            local_388 = QList<QList<QVariant>_>::size
                                                  ((QList<QList<QVariant>_> *)
                                                   &proxyDataChangeSpy.field_0x8);
                            local_38c = 1;
                            bVar3 = QTest::qCompare<long_long,int>
                                              (&local_388,&local_38c,"proxyDataChangeSpy.size()","1"
                                               ,
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                               ,0x363);
                            if (((bVar3 ^ 0xffU) & 1) == 0) {
                              QList<QList<QVariant>_>::takeFirst
                                        (&local_3a8,
                                         (QList<QList<QVariant>_> *)&proxyDataChangeSpy.field_0x8);
                              QList<QVariant>::operator=((QList<QVariant> *)local_2f0,&local_3a8);
                              QList<QVariant>::~QList(&local_3a8);
                              pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_2f0,0);
                              QVariant::value<QModelIndex>(&local_3c0,pQVar8);
                              bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                                                (&local_3c0,(QModelIndex *)local_208,
                                                 "argList.at(0).value<QModelIndex>()","proxyIdX",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                 ,0x365);
                              if (((bVar3 ^ 0xffU) & 1) == 0) {
                                pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_2f0,1);
                                QVariant::value<QModelIndex>(&local_3d8,pQVar8);
                                bVar3 = QTest::qCompare<QModelIndex,QModelIndex>
                                                  (&local_3d8,(QModelIndex *)local_208,
                                                   "argList.at(1).value<QModelIndex>()","proxyIdX",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x366);
                                if (((bVar3 ^ 0xffU) & 1) == 0) {
                                  pQVar8 = QList<QVariant>::at((QList<QVariant> *)local_2f0,2);
                                  QVariant::value<QList<int>>(&local_3f0,pQVar8);
                                  QList<int>::operator=((QList<int> *)local_338,&local_3f0);
                                  QList<int>::~QList(&local_3f0);
                                  local_3f8 = QList<int>::size((QList<int> *)local_338);
                                  local_400[1] = 1;
                                  bVar3 = QTest::qCompare<long_long,int>
                                                    (&local_3f8,(qint32 *)(local_400 + 1),
                                                     "rolesVector.size()","1",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x368);
                                  if (((bVar3 ^ 0xffU) & 1) == 0) {
                                    local_400[0] = UserRole;
                                    bVar3 = QListSpecialMethodsBase<int>::contains<Qt::ItemDataRole>
                                                      ((QListSpecialMethodsBase<int> *)local_338,
                                                       local_400);
                                    bVar2 = QTest::qVerify(bVar3,
                                                  "rolesVector.contains(Qt::UserRole)","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x369);
                                    if (((bVar2 ^ 0xff) & 1) == 0) {
                                      QMap<int,_QVariant>::clear
                                                ((QMap<int,_QVariant> *)(local_60 + 8));
                                      QVariant::QVariant(&local_420,6);
                                      local_424 = 0x100;
                                      pQVar9 = QMap<int,_QVariant>::operator[]
                                                         ((QMap<int,_QVariant> *)(local_60 + 8),
                                                          &local_424);
                                      QVariant::operator=(pQVar9,&local_420);
                                      QVariant::~QVariant(&local_420);
                                      bVar2 = InsertProxyModel::setItemData
                                                        ((QModelIndex *)local_1e8,(QMap *)local_208)
                                      ;
                                      bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                                                                                                                          
                                                  "proxyModel.setItemData(proxyIdX, itemDataSet)",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x36c);
                                      if ((bVar2 & 1) == 0) {
                                        proxyDataChangeSpy._124_4_ = 1;
                                      }
                                      else {
                                        local_430 = QList<QList<QVariant>_>::size
                                                              ((QList<QList<QVariant>_> *)
                                                               &proxyDataChangeSpy.field_0x8);
                                        local_434 = 0;
                                        bVar3 = QTest::qCompare<long_long,int>
                                                          (&local_430,&local_434,
                                                           "proxyDataChangeSpy.size()","0",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x36e);
                                        if (((bVar3 ^ 0xffU) & 1) == 0) {
                                          QObject::deleteLater();
                                          proxyDataChangeSpy._124_4_ = 0;
                                        }
                                        else {
                                          proxyDataChangeSpy._124_4_ = 1;
                                        }
                                      }
                                    }
                                    else {
                                      proxyDataChangeSpy._124_4_ = 1;
                                    }
                                  }
                                  else {
                                    proxyDataChangeSpy._124_4_ = 1;
                                  }
                                }
                                else {
                                  proxyDataChangeSpy._124_4_ = 1;
                                }
                              }
                              else {
                                proxyDataChangeSpy._124_4_ = 1;
                              }
                            }
                            else {
                              proxyDataChangeSpy._124_4_ = 1;
                            }
                          }
                        }
                        else {
                          proxyDataChangeSpy._124_4_ = 1;
                        }
                      }
                      else {
                        proxyDataChangeSpy._124_4_ = 1;
                      }
                    }
                    else {
                      proxyDataChangeSpy._124_4_ = 1;
                    }
                  }
                  else {
                    proxyDataChangeSpy._124_4_ = 1;
                  }
                }
                else {
                  proxyDataChangeSpy._124_4_ = 1;
                }
              }
              else {
                proxyDataChangeSpy._124_4_ = 1;
              }
              QList<int>::~QList((QList<int> *)local_338);
            }
            else {
              proxyDataChangeSpy._124_4_ = 1;
            }
          }
          else {
            proxyDataChangeSpy._124_4_ = 1;
          }
          QList<QVariant>::~QList((QList<QVariant> *)local_2f0);
        }
        else {
          proxyDataChangeSpy._124_4_ = 1;
        }
      }
      QSignalSpy::~QSignalSpy((QSignalSpy *)local_2c8);
    }
    else {
      proxyDataChangeSpy._124_4_ = 1;
    }
    InsertProxyModel::~InsertProxyModel(local_1e8);
    QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)(local_60 + 8));
  }
  return;
}

Assistant:

void tst_InsertProxyModel::testSetItemDataDataChanged()
{
    QFETCH(QAbstractItemModel *, baseModel);
    if (!baseModel)
        return;
    QFETCH(int, idxRow);
    QFETCH(int, idxCol);
    QMap<int, QVariant> itemDataSet{{// TextAlignmentRole
                                     std::make_pair<int, QVariant>(Qt::UserRole, 5),
                                     std::make_pair<int, QVariant>(Qt::DisplayRole, QStringLiteral("Test")),
                                     std::make_pair<int, QVariant>(Qt::ToolTipRole, QStringLiteral("ToolTip"))}};
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setMergeDisplayEdit(true);
    proxyModel.setInsertDirection(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(baseModel);
    const QModelIndex proxyIdX = proxyModel.index(idxRow, idxCol);
    QVERIFY(proxyModel.setData(proxyIdX, Qt::AlignRight, Qt::TextAlignmentRole));
    QSignalSpy proxyDataChangeSpy(&proxyModel, SIGNAL(dataChanged(QModelIndex, QModelIndex, QVector<int>)));
    QVERIFY(proxyModel.setItemData(proxyIdX, itemDataSet));
    QCOMPARE(proxyDataChangeSpy.size(), 1);
    auto argList = proxyDataChangeSpy.takeFirst();
    QCOMPARE(argList.at(0).value<QModelIndex>(), proxyIdX);
    QCOMPARE(argList.at(1).value<QModelIndex>(), proxyIdX);
    auto rolesVector = argList.at(2).value<QVector<int>>();
#ifndef SKIP_QTBUG_45114
    QCOMPARE(rolesVector.size(), 4);
    QVERIFY(!rolesVector.contains(Qt::TextAlignmentRole));
#endif
    QVERIFY(rolesVector.contains(Qt::ToolTipRole));
    QVERIFY(rolesVector.contains(Qt::EditRole));
    QVERIFY(rolesVector.contains(Qt::DisplayRole));
    QVERIFY(rolesVector.contains(Qt::UserRole));
    itemDataSet[Qt::UserRole] = 6;
    QVERIFY(proxyModel.setItemData(proxyIdX, itemDataSet));
    QCOMPARE(proxyDataChangeSpy.size(), 1);
    argList = proxyDataChangeSpy.takeFirst();
    QCOMPARE(argList.at(0).value<QModelIndex>(), proxyIdX);
    QCOMPARE(argList.at(1).value<QModelIndex>(), proxyIdX);
    rolesVector = argList.at(2).value<QVector<int>>();
    QCOMPARE(rolesVector.size(), 1);
    QVERIFY(rolesVector.contains(Qt::UserRole));
    itemDataSet.clear();
    itemDataSet[Qt::UserRole] = 6;
    QVERIFY(proxyModel.setItemData(proxyIdX, itemDataSet));
#ifndef SKIP_QTBUG_45114
    QCOMPARE(proxyDataChangeSpy.size(), 0);
#endif
    baseModel->deleteLater();
}